

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pyraminx.cpp
# Opt level: O0

int __thiscall Pyraminx::count_correct_edge(Pyraminx *this)

{
  int iVar1;
  Color CVar2;
  Color CVar3;
  Color CVar4;
  Color CVar5;
  Color CVar6;
  element_type *peVar7;
  bool local_10d;
  bool local_101;
  bool local_e1;
  bool local_cd;
  int right_correct;
  int left_correct;
  Color adjacent_left;
  Color adjacent_right;
  Color current_right;
  Color current_left;
  Corner current_corner;
  shared_ptr<Face> adjacent_face_1;
  int i_1;
  int bottom_correct;
  int top_correct;
  Color adjacent_bottom;
  Color adjacent_top;
  Color current_bottom;
  undefined1 local_40 [4];
  Color current_top;
  shared_ptr<Face> adjacent_face;
  undefined1 local_28 [4];
  int i;
  shared_ptr<Face> current_face;
  int count;
  Pyraminx *this_local;
  
  current_face.super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ = 0;
  std::shared_ptr<Face>::shared_ptr((shared_ptr<Face> *)local_28,&this->blue_face);
  for (adjacent_face.super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
            0; adjacent_face.super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
               _4_4_ < 3;
      adjacent_face.super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
           adjacent_face.super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
           _4_4_ + 1) {
    peVar7 = std::__shared_ptr_access<Face,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Face,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_28);
    std::shared_ptr<Face>::shared_ptr
              ((shared_ptr<Face> *)local_40,&(peVar7->neighbors).U_neighbor_right);
    peVar7 = std::__shared_ptr_access<Face,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Face,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_28);
    CVar2 = Face::get_triangle_color(peVar7,U,1,2);
    peVar7 = std::__shared_ptr_access<Face,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Face,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_28);
    CVar3 = Face::get_triangle_color(peVar7,U,2,4);
    peVar7 = std::__shared_ptr_access<Face,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Face,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_40);
    CVar4 = Face::get_triangle_color(peVar7,U,1,0);
    peVar7 = std::__shared_ptr_access<Face,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Face,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_40);
    CVar5 = Face::get_triangle_color(peVar7,U,2,0);
    peVar7 = std::__shared_ptr_access<Face,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Face,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_28);
    CVar6 = Face::get_center_color(peVar7);
    local_cd = false;
    if (CVar2 == CVar6) {
      peVar7 = std::__shared_ptr_access<Face,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<Face,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          local_40);
      CVar2 = Face::get_center_color(peVar7);
      local_cd = CVar4 == CVar2;
    }
    peVar7 = std::__shared_ptr_access<Face,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Face,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_28);
    CVar2 = Face::get_center_color(peVar7);
    local_e1 = false;
    if (CVar3 == CVar2) {
      peVar7 = std::__shared_ptr_access<Face,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<Face,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          local_40);
      CVar2 = Face::get_center_color(peVar7);
      local_e1 = CVar5 == CVar2;
    }
    current_face.super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
         current_face.super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ +
         (uint)local_cd + (uint)local_e1;
    std::shared_ptr<Face>::operator=((shared_ptr<Face> *)local_28,(shared_ptr<Face> *)local_40);
    std::shared_ptr<Face>::~shared_ptr((shared_ptr<Face> *)local_40);
  }
  for (adjacent_face_1.super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_
            = 0;
      iVar1 = current_face.super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
              _4_4_,
      adjacent_face_1.super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ <
      3; adjacent_face_1.super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
         _4_4_ = adjacent_face_1.super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi._4_4_ + 1) {
    std::shared_ptr<Face>::shared_ptr((shared_ptr<Face> *)&current_left);
    if (adjacent_face_1.super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_
        == 0) {
      current_right = blue;
      std::shared_ptr<Face>::operator=((shared_ptr<Face> *)&current_left,&this->yellow_face);
    }
    else if (adjacent_face_1.super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
             _4_4_ == 1) {
      current_right = yellow;
      std::shared_ptr<Face>::operator=((shared_ptr<Face> *)&current_left,&this->red_face);
    }
    else if (adjacent_face_1.super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
             _4_4_ == 2) {
      current_right = red;
      std::shared_ptr<Face>::operator=((shared_ptr<Face> *)&current_left,&this->blue_face);
    }
    peVar7 = std::__shared_ptr_access<Face,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Face,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &this->green_face);
    CVar2 = Face::get_triangle_color(peVar7,current_right,3,2);
    peVar7 = std::__shared_ptr_access<Face,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Face,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &this->green_face);
    CVar3 = Face::get_triangle_color(peVar7,current_right,3,4);
    peVar7 = std::__shared_ptr_access<Face,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Face,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &current_left);
    CVar4 = Face::get_triangle_color(peVar7,U,3,2);
    peVar7 = std::__shared_ptr_access<Face,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Face,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &current_left);
    CVar5 = Face::get_triangle_color(peVar7,U,3,4);
    local_101 = false;
    if (CVar2 == green) {
      peVar7 = std::__shared_ptr_access<Face,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<Face,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          &current_left);
      CVar2 = Face::get_center_color(peVar7);
      local_101 = CVar5 == CVar2;
    }
    local_10d = false;
    if (CVar3 == green) {
      peVar7 = std::__shared_ptr_access<Face,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<Face,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          &current_left);
      CVar2 = Face::get_center_color(peVar7);
      local_10d = CVar4 == CVar2;
    }
    current_face.super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
         current_face.super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ +
         (uint)local_101 + (uint)local_10d;
    std::shared_ptr<Face>::~shared_ptr((shared_ptr<Face> *)&current_left);
  }
  std::shared_ptr<Face>::~shared_ptr((shared_ptr<Face> *)local_28);
  return iVar1;
}

Assistant:

int Pyraminx::count_correct_edge(){
    int count = 0;
    // Check the edges between faces sharing the upper corner
    std::shared_ptr<Face> current_face = blue_face;
    for(int i = 0; i < 3; i++){
        std::shared_ptr<Face> adjacent_face = current_face->neighbors.U_neighbor_right;
        Color current_top = current_face->get_triangle_color(Corner::U, 1, 2);
        Color current_bottom = current_face->get_triangle_color(Corner::U, 2, 4);
        Color adjacent_top = adjacent_face->get_triangle_color(Corner::U, 1, 0);
        Color adjacent_bottom = adjacent_face->get_triangle_color(Corner::U, 2, 0);
        int top_correct = (current_top == current_face->get_center_color()) 
            && (adjacent_top == adjacent_face->get_center_color());
        int bottom_correct = (current_bottom == current_face->get_center_color()) 
            && (adjacent_bottom == adjacent_face->get_center_color());
        count = count + top_correct + bottom_correct;
        current_face = adjacent_face;
    }
    // Check the edges between the bottom face (green) and the others
    for(int i = 0; i < 3; i++){
        std::shared_ptr<Face> adjacent_face;
        Corner current_corner;
        switch (i)
        {
        case 0:
            current_corner = Corner::L;
            adjacent_face = yellow_face;
            break;
        case 1:
            current_corner = Corner::R;
            adjacent_face = red_face;
            break;
        case 2:
            current_corner = Corner::B;
            adjacent_face = blue_face;
            break;
        }

        Color current_left  = green_face->get_triangle_color(current_corner, 3, 2);
        Color current_right = green_face->get_triangle_color(current_corner, 3, 4);

        Color adjacent_right = adjacent_face->get_triangle_color(Corner::U, 3, 2);
        Color adjacent_left = adjacent_face->get_triangle_color(Corner::U, 3, 4);

        int left_correct = (current_left == Color::green) && (adjacent_left == adjacent_face->get_center_color());
        int right_correct = (current_right == Color::green) && (adjacent_right == adjacent_face->get_center_color());

        count = count + left_correct + right_correct;
    }
    //printf("Correct edge pieces: %i/12\n", count);
    return count;
}